

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int multiSelect(Parse *pParse,Select *p,SelectDest *pDest)

{
  byte *pbVar1;
  u32 *puVar2;
  u8 uVar3;
  short sVar4;
  undefined4 p1;
  sqlite3 *psVar5;
  SrcList *pSVar6;
  Vdbe *v;
  Parse *pPVar7;
  int *piVar8;
  undefined4 uVar9;
  byte bVar10;
  ushort uVar11;
  LogEst LVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint p2;
  uint uVar18;
  uint p2_00;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  Vdbe *pVVar23;
  int *piVar24;
  ExprList *pEVar25;
  KeyInfo *pKVar26;
  CollSeq *pCVar27;
  Op *pOVar28;
  Expr *pEVar29;
  char *pcVar30;
  long lVar31;
  anon_union_4_2_6146edf4_for_u *paVar32;
  Select *pSVar33;
  int extraout_EDX;
  int iVar34;
  int nExtra;
  char *pcVar35;
  ushort uVar36;
  int iVar37;
  ulong uVar38;
  int iVar39;
  Select *pSVar40;
  Select *pSVar41;
  bool bVar42;
  SelectDest destA;
  SelectDest dest;
  KeyInfo *local_58;
  SelectDest local_50;
  
  psVar5 = pParse->db;
  pSVar41 = p->pPrior;
  dest.eDest = pDest->eDest;
  dest._1_3_ = *(undefined3 *)&pDest->field_0x1;
  dest.iSDParm = pDest->iSDParm;
  dest.iSdst = pDest->iSdst;
  dest.nSdst = pDest->nSdst;
  dest.zAffSdst._0_4_ = *(undefined4 *)&pDest->zAffSdst;
  dest.zAffSdst._4_4_ = *(undefined4 *)((long)&pDest->zAffSdst + 4);
  dest.pOrderBy._0_4_ = *(undefined4 *)&pDest->pOrderBy;
  dest.pOrderBy._4_4_ = *(undefined4 *)((long)&pDest->pOrderBy + 4);
  if (pSVar41->pOrderBy == (ExprList *)0x0) {
    if (pSVar41->pLimit == (Expr *)0x0) {
      pVVar23 = sqlite3GetVdbe(pParse);
      if (dest.eDest == '\f') {
        sqlite3VdbeAddOp3(pVVar23,0x71,dest.iSDParm,p->pEList->nExpr,0);
        dest.eDest = '\x0e';
      }
      if ((p->selFlags >> 10 & 1) == 0) {
        if ((p->selFlags >> 0xd & 1) == 0) {
          if (p->pOrderBy != (ExprList *)0x0) {
            psVar5 = pParse->db;
            pVVar23 = pParse->pVdbe;
            uVar13 = sqlite3VdbeMakeLabel(pVVar23);
            uVar14 = sqlite3VdbeMakeLabel(pVVar23);
            uVar3 = p->op;
            pSVar41 = p->pPrior;
            pEVar25 = p->pOrderBy;
            iVar19 = pEVar25->nExpr;
            if ((uVar3 != '|') && (psVar5->mallocFailed == '\0')) {
              uVar18 = 1;
              do {
                if (p->pEList->nExpr < (int)uVar18) break;
                if (iVar19 < 1) {
                  iVar34 = 0;
                }
                else {
                  paVar32 = &pEVar25->a[0].u;
                  iVar17 = 0;
                  do {
                    iVar34 = iVar17;
                    if (uVar18 == (paVar32->x).iOrderByCol) break;
                    iVar17 = iVar17 + 1;
                    paVar32 = paVar32 + 8;
                    iVar34 = iVar19;
                  } while (iVar19 != iVar17);
                }
                bVar42 = true;
                if (iVar34 == iVar19) {
                  destA.eDest = '\0';
                  destA._1_3_ = 0;
                  destA.iSDParm = 0;
                  destA._8_8_ = destA._8_8_ & 0xffffffff00000000;
                  pEVar29 = sqlite3ExprAlloc(psVar5,0x8f,(Token *)&destA,0);
                  bVar42 = pEVar29 != (Expr *)0x0;
                  if (bVar42) {
                    pbVar1 = (byte *)((long)&pEVar29->flags + 1);
                    *pbVar1 = *pbVar1 | 4;
                    (pEVar29->u).iValue = uVar18;
                    pEVar25 = sqlite3ExprListAppend(pParse,pEVar25,pEVar29);
                    p->pOrderBy = pEVar25;
                    bVar42 = true;
                    if (pEVar25 != (ExprList *)0x0) {
                      lVar31 = (long)iVar19;
                      iVar19 = iVar19 + 1;
                      pEVar25->a[lVar31].u.x.iOrderByCol = (u16)uVar18;
                      bVar42 = true;
                    }
                  }
                }
                if (!bVar42) {
                  return 7;
                }
                uVar18 = uVar18 + 1;
              } while (psVar5->mallocFailed == '\0');
            }
            piVar24 = (int *)sqlite3DbMallocRawNN(psVar5,(long)iVar19 * 4 + 4);
            if (piVar24 == (int *)0x0) {
              local_58 = (KeyInfo *)0x0;
            }
            else {
              *piVar24 = iVar19;
              iVar34 = extraout_EDX;
              if (0 < iVar19) {
                lVar31 = 0;
                do {
                  iVar34 = (&pEVar25->a[0].u)[lVar31 * 2].x.iOrderByCol - 1;
                  *(int *)((long)piVar24 + lVar31 + 4) = iVar34;
                  lVar31 = lVar31 + 4;
                } while ((ulong)(iVar19 + 1) * 4 + -4 != lVar31);
              }
              local_58 = multiSelectOrderByKeyInfo(pParse,p,iVar34);
            }
            iVar34 = 0;
            p->pOrderBy = pEVar25;
            pEVar25 = sqlite3ExprListDup(pParse->db,pEVar25,0);
            pSVar41->pOrderBy = pEVar25;
            if (uVar3 == '|') {
              pKVar26 = (KeyInfo *)0x0;
            }
            else {
              uVar18 = p->pEList->nExpr;
              iVar34 = pParse->nMem + 1;
              pParse->nMem = pParse->nMem + uVar18 + 1;
              sqlite3VdbeAddOp3(pVVar23,0x46,0,iVar34,0);
              pKVar26 = sqlite3KeyInfoAlloc(psVar5,uVar18,1);
              if (0 < (int)uVar18 && pKVar26 != (KeyInfo *)0x0) {
                uVar38 = 0;
                do {
                  pCVar27 = multiSelectCollSeq(pParse,p,(int)uVar38);
                  pKVar26->aColl[uVar38] = pCVar27;
                  pKVar26->aSortOrder[uVar38] = '\0';
                  uVar38 = uVar38 + 1;
                } while (uVar18 != uVar38);
              }
            }
            iVar17 = 0;
            p->pPrior = (Select *)0x0;
            pSVar41->pNext = (Select *)0x0;
            sqlite3ResolveOrderGroupBy(pParse,p,p->pOrderBy,"ORDER");
            if (pSVar41->pPrior == (Select *)0x0) {
              sqlite3ResolveOrderGroupBy(pParse,pSVar41,pSVar41->pOrderBy,"ORDER");
            }
            computeLimitRegisters(pParse,p,uVar13);
            iVar20 = p->iLimit;
            iVar37 = 0;
            if (iVar20 != 0 && uVar3 == '|') {
              iVar17 = pParse->nMem + 1;
              iVar37 = pParse->nMem + 2;
              pParse->nMem = iVar37;
              iVar21 = p->iOffset + 1;
              if (p->iOffset == 0) {
                iVar21 = iVar20;
              }
              sqlite3VdbeAddOp3(pVVar23,0x4e,iVar21,iVar17,0);
              sqlite3VdbeAddOp3(pVVar23,0x4e,iVar17,iVar37,0);
            }
            if (p->pLimit != (Expr *)0x0) {
              sqlite3ExprDeleteNN(psVar5,p->pLimit);
            }
            p->pLimit = (Expr *)0x0;
            iVar39 = pParse->nMem;
            iVar20 = iVar39 + 1;
            iVar21 = iVar39 + 2;
            iVar22 = iVar39 + 4;
            pParse->nMem = iVar22;
            destA.eDest = '\r';
            destA.iSDParm = iVar20;
            destA.iSdst = 0;
            destA.nSdst = 0;
            destA.zAffSdst = (char *)0x0;
            local_50.eDest = '\r';
            local_50.iSdst = 0;
            local_50.nSdst = 0;
            local_50.zAffSdst = (char *)0x0;
            iVar39 = iVar39 + 3;
            local_50.iSDParm = iVar21;
            sqlite3VdbeExplain(pParse,'\x01',"MERGE (%s)");
            iVar15 = sqlite3VdbeAddOp3(pVVar23,0xd,iVar20,0,pVVar23->nOp + 1);
            pSVar41->iLimit = iVar17;
            sqlite3VdbeExplain(pParse,'\x01',"LEFT");
            sqlite3Select(pParse,pSVar41,&destA);
            sqlite3VdbeAddOp3(pVVar23,0x43,iVar20,0,0);
            pPVar7 = pVVar23->pParse;
            pPVar7->nTempReg = '\0';
            pPVar7->nRangeReg = 0;
            iVar17 = pVVar23->nOp;
            if (pVVar23->db->mallocFailed == '\0') {
              iVar16 = iVar17 + -1;
              if (-1 < iVar15) {
                iVar16 = iVar15;
              }
              pOVar28 = pVVar23->aOp + iVar16;
            }
            else {
              pOVar28 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar28->p2 = iVar17;
            iVar16 = sqlite3VdbeAddOp3(pVVar23,0xd,iVar21,0,iVar17 + 1);
            iVar17 = p->iLimit;
            iVar15 = p->iOffset;
            p->iLimit = iVar37;
            p->iOffset = 0;
            sqlite3VdbeExplain(pParse,'\x01',"RIGHT");
            sqlite3Select(pParse,p,&local_50);
            p->iLimit = iVar17;
            p->iOffset = iVar15;
            sqlite3VdbeAddOp3(pVVar23,0x43,iVar21,0,0);
            pPVar7 = pVVar23->pParse;
            pPVar7->nTempReg = '\0';
            iVar17 = 0;
            pPVar7->nRangeReg = 0;
            iVar37 = generateOutputSubroutine(pParse,p,&destA,pDest,iVar39,iVar34,pKVar26,uVar13);
            if ((byte)(uVar3 + 0x85) < 2) {
              iVar17 = generateOutputSubroutine
                                 (pParse,p,&local_50,pDest,iVar22,iVar34,pKVar26,uVar13);
            }
            if ((pKVar26 != (KeyInfo *)0x0) &&
               (pKVar26->nRef = pKVar26->nRef - 1, pKVar26->nRef == 0)) {
              sqlite3DbFreeNN(pKVar26->db,pKVar26);
            }
            uVar18 = uVar13;
            p2 = uVar13;
            if (1 < (byte)(uVar3 + 0x83)) {
              p2 = sqlite3VdbeAddOp3(pVVar23,0xc,iVar22,iVar17,0);
              uVar18 = sqlite3VdbeAddOp3(pVVar23,0xe,iVar21,uVar13,0);
              sqlite3VdbeAddOp3(pVVar23,0xb,0,p2,0);
              LVar12 = sqlite3LogEstAdd(p->nSelectRow,pSVar41->nSelectRow);
              p->nSelectRow = LVar12;
            }
            if (uVar3 == '~') {
              p2_00 = p2;
              if (pSVar41->nSelectRow < p->nSelectRow) {
                p->nSelectRow = pSVar41->nSelectRow;
              }
            }
            else {
              p2_00 = sqlite3VdbeAddOp3(pVVar23,0xc,iVar39,iVar37,0);
              sqlite3VdbeAddOp3(pVVar23,0xe,iVar20,uVar13,0);
              sqlite3VdbeAddOp3(pVVar23,0xb,0,p2_00,0);
            }
            iVar37 = sqlite3VdbeAddOp3(pVVar23,0xc,iVar39,iVar37,0);
            sqlite3VdbeAddOp3(pVVar23,0xe,iVar20,p2,0);
            sqlite3VdbeAddOp3(pVVar23,0xb,0,uVar14,0);
            iVar34 = iVar37;
            if (uVar3 != '|') {
              if (uVar3 == '~') {
                iVar34 = iVar37 + 1;
              }
              else {
                iVar37 = sqlite3VdbeAddOp3(pVVar23,0xe,iVar20,p2,0);
                sqlite3VdbeAddOp3(pVVar23,0xb,0,uVar14,0);
              }
            }
            iVar39 = pVVar23->nOp;
            if ((byte)(uVar3 + 0x85) < 2) {
              sqlite3VdbeAddOp3(pVVar23,0xc,iVar22,iVar17,0);
            }
            sqlite3VdbeAddOp3(pVVar23,0xe,iVar21,p2_00,0);
            sqlite3VdbeAddOp3(pVVar23,0xb,0,uVar14,0);
            if (pVVar23->db->mallocFailed == '\0') {
              iVar17 = pVVar23->nOp + -1;
              if (-1 < iVar16) {
                iVar17 = iVar16;
              }
              pOVar28 = pVVar23->aOp + iVar17;
            }
            else {
              pOVar28 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar28->p2 = pVVar23->nOp;
            sqlite3VdbeAddOp3(pVVar23,0xe,iVar20,uVar18,0);
            sqlite3VdbeAddOp3(pVVar23,0xe,iVar21,p2_00,0);
            piVar8 = pVVar23->pParse->aLabel;
            if (piVar8 != (int *)0x0) {
              piVar8[(int)~uVar14] = pVVar23->nOp;
            }
            iVar17 = sqlite3VdbeAddOp3(pVVar23,0x56,0,0,0);
            sqlite3VdbeChangeP4(pVVar23,iVar17,(char *)piVar24,-0xf);
            iVar19 = sqlite3VdbeAddOp3(pVVar23,0x57,destA.iSdst,local_50.iSdst,iVar19);
            sqlite3VdbeChangeP4(pVVar23,iVar19,(char *)local_58,-9);
            if (0 < (long)pVVar23->nOp) {
              pVVar23->aOp[(long)pVVar23->nOp + -1].p5 = 1;
            }
            sqlite3VdbeAddOp3(pVVar23,0x10,iVar34,iVar37,iVar39);
            piVar24 = pVVar23->pParse->aLabel;
            if (piVar24 != (int *)0x0) {
              piVar24[(int)~uVar13] = pVVar23->nOp;
            }
            if (p->pPrior != (Select *)0x0) {
              clearSelect(psVar5,p->pPrior,1);
            }
            p->pPrior = pSVar41;
            pSVar41->pNext = p;
            sqlite3VdbeExplainPop(pParse);
            return (uint)(pParse->nErr != 0);
          }
          if (pSVar41->pPrior == (Select *)0x0) {
            sqlite3VdbeExplain(pParse,'\x01',"COMPOUND QUERY");
            sqlite3VdbeExplain(pParse,'\x01',"LEFT-MOST SUBQUERY");
          }
          uVar3 = p->op;
          if ((uVar3 == '{') || (uVar3 == '}')) {
            uVar3 = dest.eDest;
            iVar34 = dest.iSDParm;
            if (dest.eDest != '\x01') {
              iVar34 = pParse->nTab;
              pParse->nTab = iVar34 + 1;
              iVar19 = sqlite3VdbeAddOp3(pVVar23,0x71,iVar34,0,0);
              p->addrOpenEphm[0] = iVar19;
              pSVar40 = p;
              do {
                pSVar33 = pSVar40;
                pSVar40 = pSVar33->pNext;
              } while (pSVar40 != (Select *)0x0);
              puVar2 = &pSVar33->selFlags;
              *(byte *)puVar2 = (byte)*puVar2 | 0x20;
            }
            destA.eDest = '\x01';
            destA.iSDParm = iVar34;
            destA.iSdst = 0;
            destA.nSdst = 0;
            destA.zAffSdst = (char *)0x0;
            iVar17 = sqlite3Select(pParse,pSVar41,&destA);
            if (iVar17 == 0) {
              p->pPrior = (Select *)0x0;
              pEVar29 = p->pLimit;
              p->pLimit = (Expr *)0x0;
              destA.eDest = (p->op == '}') + '\x01';
              bVar10 = p->op + 0x84;
              if (bVar10 < 3) {
                pcVar35 = (&PTR_anon_var_dwarf_2581d_001bfdc0)[bVar10];
              }
              else {
                pcVar35 = "UNION";
              }
              sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar35);
              iVar19 = sqlite3Select(pParse,p,&destA);
              if (p->pOrderBy != (ExprList *)0x0) {
                exprListDeleteNN(psVar5,p->pOrderBy);
              }
              pSVar40 = p->pPrior;
              p->pPrior = pSVar41;
              p->pOrderBy = (ExprList *)0x0;
              if (p->op == '{') {
                LVar12 = sqlite3LogEstAdd(p->nSelectRow,pSVar41->nSelectRow);
                p->nSelectRow = LVar12;
              }
              if (p->pLimit != (Expr *)0x0) {
                sqlite3ExprDeleteNN(psVar5,p->pLimit);
              }
              p->pLimit = pEVar29;
              p->iLimit = 0;
              p->iOffset = 0;
              if (uVar3 != '\x01') {
                uVar13 = sqlite3VdbeMakeLabel(pVVar23);
                uVar14 = sqlite3VdbeMakeLabel(pVVar23);
                computeLimitRegisters(pParse,p,uVar13);
                sqlite3VdbeAddOp3(pVVar23,0x24,iVar34,uVar13,0);
                iVar20 = pVVar23->nOp;
                selectInnerLoop(pParse,p,iVar34,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,uVar14,
                                uVar13);
                piVar24 = pVVar23->pParse->aLabel;
                if (piVar24 != (int *)0x0) {
                  piVar24[(int)~uVar14] = pVVar23->nOp;
                }
                sqlite3VdbeAddOp3(pVVar23,5,iVar34,iVar20,0);
                piVar24 = pVVar23->pParse->aLabel;
                if (piVar24 != (int *)0x0) {
                  piVar24[(int)~uVar13] = pVVar23->nOp;
                }
                sqlite3VdbeAddOp3(pVVar23,0x75,iVar34,0,0);
              }
            }
            else {
              pSVar40 = (Select *)0x0;
              iVar19 = iVar17;
            }
          }
          else if (uVar3 == '|') {
            iVar19 = p->iOffset;
            pSVar41->iLimit = p->iLimit;
            pSVar41->iOffset = iVar19;
            pSVar41->pLimit = p->pLimit;
            iVar17 = sqlite3Select(pParse,pSVar41,&dest);
            p->pLimit = (Expr *)0x0;
            if (iVar17 == 0) {
              iVar34 = 0;
              p->pPrior = (Select *)0x0;
              p1 = pSVar41->iLimit;
              uVar9 = pSVar41->iOffset;
              p->iLimit = p1;
              p->iOffset = uVar9;
              if (p1 != 0) {
                iVar34 = sqlite3VdbeAddOp3(pVVar23,0x14,p1,0,0);
                iVar19 = p->iOffset;
                if (iVar19 != 0) {
                  sqlite3VdbeAddOp3(pVVar23,0x99,p->iLimit,iVar19 + 1,iVar19);
                }
              }
              sqlite3VdbeExplain(pParse,'\x01',"UNION ALL");
              iVar19 = sqlite3Select(pParse,p,&dest);
              pSVar40 = p->pPrior;
              p->pPrior = pSVar41;
              LVar12 = sqlite3LogEstAdd(p->nSelectRow,pSVar41->nSelectRow);
              p->nSelectRow = LVar12;
              if (pSVar41->pLimit != (Expr *)0x0) {
                iVar20 = sqlite3ExprIsInteger(pSVar41->pLimit->pLeft,(int *)&destA);
                if ((0 < (int)destA._0_4_ && iVar20 != 0) &&
                   (sVar4 = p->nSelectRow, LVar12 = sqlite3LogEst(destA._0_8_ & 0xffffffff),
                   LVar12 < sVar4)) {
                  p->nSelectRow = LVar12;
                }
              }
              if (iVar34 != 0) {
                if (pVVar23->db->mallocFailed == '\0') {
                  iVar20 = pVVar23->nOp + -1;
                  if (-1 < iVar34) {
                    iVar20 = iVar34;
                  }
                  pOVar28 = pVVar23->aOp + iVar20;
                }
                else {
                  pOVar28 = (Op *)&sqlite3VdbeGetOp_dummy;
                }
                pOVar28->p2 = pVVar23->nOp;
              }
            }
            else {
              pSVar40 = (Select *)0x0;
              iVar19 = iVar17;
            }
          }
          else {
            iVar34 = pParse->nTab;
            pParse->nTab = iVar34 + 2;
            iVar19 = sqlite3VdbeAddOp3(pVVar23,0x71,iVar34,0,0);
            p->addrOpenEphm[0] = iVar19;
            pSVar40 = p;
            do {
              pSVar33 = pSVar40;
              pSVar40 = pSVar33->pNext;
            } while (pSVar40 != (Select *)0x0);
            puVar2 = &pSVar33->selFlags;
            *(byte *)puVar2 = (byte)*puVar2 | 0x20;
            destA.eDest = '\x01';
            destA.iSDParm = iVar34;
            destA.iSdst = 0;
            destA.nSdst = 0;
            destA.zAffSdst = (char *)0x0;
            iVar17 = sqlite3Select(pParse,pSVar41,&destA);
            if (iVar17 == 0) {
              iVar20 = iVar34 + 1;
              iVar19 = sqlite3VdbeAddOp3(pVVar23,0x71,iVar20,0,0);
              p->addrOpenEphm[1] = iVar19;
              p->pPrior = (Select *)0x0;
              pEVar29 = p->pLimit;
              p->pLimit = (Expr *)0x0;
              destA.iSDParm = iVar20;
              bVar10 = p->op + 0x84;
              if (bVar10 < 3) {
                pcVar35 = (&PTR_anon_var_dwarf_2581d_001bfdc0)[bVar10];
              }
              else {
                pcVar35 = "UNION";
              }
              sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar35);
              iVar19 = sqlite3Select(pParse,p,&destA);
              pSVar40 = p->pPrior;
              p->pPrior = pSVar41;
              if (pSVar41->nSelectRow < p->nSelectRow) {
                p->nSelectRow = pSVar41->nSelectRow;
              }
              if (p->pLimit != (Expr *)0x0) {
                sqlite3ExprDeleteNN(psVar5,p->pLimit);
              }
              p->pLimit = pEVar29;
              uVar13 = sqlite3VdbeMakeLabel(pVVar23);
              uVar14 = sqlite3VdbeMakeLabel(pVVar23);
              computeLimitRegisters(pParse,p,uVar13);
              sqlite3VdbeAddOp3(pVVar23,0x24,iVar34,uVar13,0);
              if (pParse->nTempReg == '\0') {
                iVar37 = pParse->nMem + 1;
                pParse->nMem = iVar37;
              }
              else {
                bVar10 = pParse->nTempReg - 1;
                pParse->nTempReg = bVar10;
                iVar37 = pParse->aTempReg[bVar10];
              }
              iVar21 = sqlite3VdbeAddOp3(pVVar23,0x80,iVar34,iVar37,0);
              iVar22 = sqlite3VdbeAddOp3(pVVar23,0x1c,iVar20,uVar14,iVar37);
              if (pVVar23->db->mallocFailed == '\0') {
                pOVar28 = pVVar23->aOp;
                pOVar28[iVar22].p4type = -3;
                pOVar28[iVar22].p4.i = 0;
              }
              if (iVar37 != 0) {
                bVar10 = pParse->nTempReg;
                if ((ulong)bVar10 < 8) {
                  pParse->nTempReg = bVar10 + 1;
                  pParse->aTempReg[bVar10] = iVar37;
                }
              }
              selectInnerLoop(pParse,p,iVar34,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,uVar14,uVar13)
              ;
              piVar24 = pVVar23->pParse->aLabel;
              if (piVar24 != (int *)0x0) {
                piVar24[(int)~uVar14] = pVVar23->nOp;
              }
              sqlite3VdbeAddOp3(pVVar23,5,iVar34,iVar21,0);
              piVar24 = pVVar23->pParse->aLabel;
              if (piVar24 != (int *)0x0) {
                piVar24[(int)~uVar13] = pVVar23->nOp;
              }
              sqlite3VdbeAddOp3(pVVar23,0x75,iVar20,0,0);
              sqlite3VdbeAddOp3(pVVar23,0x75,iVar34,0,0);
            }
            else {
              pSVar40 = (Select *)0x0;
              iVar19 = iVar17;
            }
          }
          if (iVar17 != 0) goto LAB_00173f6f;
          if (p->pNext == (Select *)0x0) {
            sqlite3VdbeExplainPop(pParse);
          }
        }
        else {
          if (p->pWin == (Window *)0x0) {
            pSVar6 = p->pSrc;
            iVar19 = p->pEList->nExpr;
            v = pParse->pVdbe;
            pSVar41 = p->pPrior;
            iVar34 = sqlite3AuthCheck(pParse,0x21,(char *)0x0,(char *)0x0,(char *)0x0);
            if (iVar34 == 0) {
              uVar13 = sqlite3VdbeMakeLabel(v);
              p->nSelectRow = 0x140;
              computeLimitRegisters(pParse,p,uVar13);
              pEVar29 = p->pLimit;
              iVar34 = p->iLimit;
              iVar17 = p->iOffset;
              p->pLimit = (Expr *)0x0;
              p->iLimit = 0;
              p->iOffset = 0;
              iVar20 = 0;
              if (0 < (long)pSVar6->nSrc) {
                lVar31 = 0;
                do {
                  if (((&pSVar6->a[0].fg.field_0x1)[lVar31] & 0x20) != 0) {
                    iVar20 = *(int *)((long)&pSVar6->a[0].iCursor + lVar31);
                    goto LAB_00174c56;
                  }
                  lVar31 = lVar31 + 0x70;
                } while ((long)pSVar6->nSrc * 0x70 - lVar31 != 0);
                iVar20 = 0;
              }
LAB_00174c56:
              pEVar25 = p->pOrderBy;
              iVar37 = pParse->nTab;
              iVar21 = iVar37 + 1;
              pParse->nTab = iVar21;
              if (p->op == '{') {
                bVar10 = (pEVar25 != (ExprList *)0x0) * '\x02' + 6;
                pParse->nTab = iVar37 + 2;
              }
              else {
                bVar10 = (pEVar25 != (ExprList *)0x0) * '\x02' | 5;
                iVar21 = 0;
              }
              destA.eDest = bVar10;
              destA.iSDParm = iVar37;
              destA.iSdst = 0;
              destA.nSdst = 0;
              destA.zAffSdst = (char *)0x0;
              iVar22 = pParse->nMem + 1;
              pParse->nMem = iVar22;
              sqlite3VdbeAddOp3(v,0x74,iVar20,iVar22,iVar19);
              if (pEVar25 == (ExprList *)0x0) {
                sqlite3VdbeAddOp3(v,0x71,iVar37,iVar19,0);
              }
              else {
                pKVar26 = multiSelectOrderByKeyInfo(pParse,p,nExtra);
                iVar19 = sqlite3VdbeAddOp3(v,0x71,iVar37,pEVar25->nExpr + 2,0);
                sqlite3VdbeChangeP4(v,iVar19,(char *)pKVar26,-9);
                destA.pOrderBy = pEVar25;
              }
              if (iVar21 != 0) {
                iVar19 = sqlite3VdbeAddOp3(v,0x71,iVar21,0,0);
                p->addrOpenEphm[0] = iVar19;
                *(byte *)&p->selFlags = (byte)p->selFlags | 0x20;
              }
              p->pOrderBy = (ExprList *)0x0;
              pSVar41->pNext = (Select *)0x0;
              sqlite3VdbeExplain(pParse,'\x01',"SETUP");
              iVar19 = sqlite3Select(pParse,pSVar41,&destA);
              pSVar41->pNext = p;
              if (iVar19 == 0) {
                iVar19 = sqlite3VdbeAddOp3(v,0x24,iVar37,uVar13,0);
                sqlite3VdbeAddOp3(v,0x82,iVar20,0,0);
                if (pEVar25 == (ExprList *)0x0) {
                  iVar15 = 0x80;
                  iVar39 = 0;
                  iVar21 = iVar22;
                }
                else {
                  iVar15 = 0x5a;
                  iVar21 = pEVar25->nExpr + 1;
                  iVar39 = iVar22;
                }
                sqlite3VdbeAddOp3(v,iVar15,iVar37,iVar21,iVar39);
                sqlite3VdbeAddOp3(v,0x7c,iVar37,0,0);
                uVar14 = sqlite3VdbeMakeLabel(v);
                if (0 < iVar17) {
                  sqlite3VdbeAddOp3(v,0x2f,iVar17,uVar14,1);
                }
                selectInnerLoop(pParse,p,iVar20,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,uVar14,
                                uVar13);
                if (iVar34 != 0) {
                  sqlite3VdbeAddOp3(v,0x31,iVar34,uVar13,0);
                }
                piVar24 = v->pParse->aLabel;
                if (piVar24 != (int *)0x0) {
                  piVar24[(int)~uVar14] = v->nOp;
                }
                if ((p->selFlags & 8) == 0) {
                  p->pPrior = (Select *)0x0;
                  sqlite3VdbeExplain(pParse,'\x01',"RECURSIVE STEP");
                  sqlite3Select(pParse,p,&destA);
                  p->pPrior = pSVar41;
                }
                else {
                  sqlite3ErrorMsg(pParse,"recursive aggregate queries not supported");
                }
                sqlite3VdbeAddOp3(v,0xb,0,iVar19,0);
                piVar24 = v->pParse->aLabel;
                if (piVar24 != (int *)0x0) {
                  piVar24[(int)~uVar13] = v->nOp;
                }
              }
              if (p->pOrderBy != (ExprList *)0x0) {
                exprListDeleteNN(pParse->db,p->pOrderBy);
              }
              p->pOrderBy = pEVar25;
              p->pLimit = pEVar29;
            }
          }
          else {
            sqlite3ErrorMsg(pParse,"cannot use window functions in recursive queries");
          }
          pSVar40 = (Select *)0x0;
          iVar19 = 0;
        }
        if ((p->selFlags & 0x20) != 0) {
          iVar34 = p->pEList->nExpr;
          pKVar26 = sqlite3KeyInfoAlloc(psVar5,iVar34,1);
          if (pKVar26 == (KeyInfo *)0x0) {
            iVar19 = 7;
          }
          else {
            if (0 < iVar34) {
              lVar31 = 0;
              do {
                pCVar27 = multiSelectCollSeq(pParse,p,(int)lVar31);
                pKVar26->aColl[lVar31] = pCVar27;
                if (pCVar27 == (CollSeq *)0x0) {
                  pKVar26->aColl[lVar31] = psVar5->pDfltColl;
                }
                lVar31 = lVar31 + 1;
              } while (iVar34 != (int)lVar31);
            }
            if (p != (Select *)0x0) {
              do {
                lVar31 = 0;
                do {
                  iVar17 = p->addrOpenEphm[lVar31];
                  if ((long)iVar17 < 0) break;
                  pOVar28 = (Op *)&sqlite3VdbeGetOp_dummy;
                  if (pVVar23->db->mallocFailed == '\0') {
                    pOVar28 = pVVar23->aOp + iVar17;
                  }
                  pOVar28->p2 = iVar34;
                  pKVar26->nRef = pKVar26->nRef + 1;
                  sqlite3VdbeChangeP4(pVVar23,iVar17,(char *)pKVar26,-9);
                  p->addrOpenEphm[lVar31] = -1;
                  lVar31 = lVar31 + 1;
                } while (lVar31 == 1);
                p = p->pPrior;
              } while (p != (Select *)0x0);
            }
            pKVar26->nRef = pKVar26->nRef - 1;
            if (pKVar26->nRef == 0) {
              sqlite3DbFreeNN(pKVar26->db,pKVar26);
            }
          }
        }
      }
      else {
        pEVar29 = p->pLimit;
        uVar11 = (ushort)(pEVar29 == (Expr *)0x0);
        uVar36 = uVar11 ^ 1;
        do {
          pSVar41 = p;
          uVar36 = uVar36 + uVar11;
          p = pSVar41->pPrior;
        } while (pSVar41->pPrior != (Select *)0x0);
        sqlite3VdbeExplain(pParse,'\0',"SCAN %d CONSTANT ROW%s");
        if (pSVar41 == (Select *)0x0) {
          pSVar40 = (Select *)0x0;
          iVar19 = 0;
        }
        else {
          do {
            pSVar40 = (Select *)0x0;
            selectInnerLoop(pParse,pSVar41,-1,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,1,1);
            iVar19 = 0;
            if (pEVar29 != (Expr *)0x0) break;
            pSVar41->nSelectRow = uVar36;
            pSVar41 = pSVar41->pNext;
            pSVar40 = (Select *)0x0;
            iVar19 = 0;
          } while (pSVar41 != (Select *)0x0);
        }
      }
      goto LAB_00173f6f;
    }
    pcVar35 = "LIMIT";
  }
  else {
    pcVar35 = "ORDER BY";
  }
  bVar10 = p->op + 0x84;
  if (bVar10 < 3) {
    pcVar30 = (&PTR_anon_var_dwarf_2581d_001bfdc0)[bVar10];
  }
  else {
    pcVar30 = "UNION";
  }
  pSVar40 = (Select *)0x0;
  sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",pcVar35,pcVar30);
  iVar19 = 1;
LAB_00173f6f:
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  if (pSVar40 != (Select *)0x0) {
    clearSelect(psVar5,pSVar40,1);
  }
  return iVar19;
}

Assistant:

static int multiSelect(
  Parse *pParse,        /* Parsing context */
  Select *p,            /* The right-most of SELECTs to be coded */
  SelectDest *pDest     /* What to do with query results */
){
  int rc = SQLITE_OK;   /* Success code from a subroutine */
  Select *pPrior;       /* Another SELECT immediately to our left */
  Vdbe *v;              /* Generate code to this VDBE */
  SelectDest dest;      /* Alternative data destination */
  Select *pDelete = 0;  /* Chain of simple selects to delete */
  sqlite3 *db;          /* Database connection */

  /* Make sure there is no ORDER BY or LIMIT clause on prior SELECTs.  Only
  ** the last (right-most) SELECT in the series may have an ORDER BY or LIMIT.
  */
  assert( p && p->pPrior );  /* Calling function guarantees this much */
  assert( (p->selFlags & SF_Recursive)==0 || p->op==TK_ALL || p->op==TK_UNION );
  db = pParse->db;
  pPrior = p->pPrior;
  dest = *pDest;
  if( pPrior->pOrderBy || pPrior->pLimit ){
    sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",
      pPrior->pOrderBy!=0 ? "ORDER BY" : "LIMIT", selectOpName(p->op));
    rc = 1;
    goto multi_select_end;
  }

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );  /* The VDBE already created by calling function */

  /* Create the destination temporary table if necessary
  */
  if( dest.eDest==SRT_EphemTab ){
    assert( p->pEList );
    sqlite3VdbeAddOp2(v, OP_OpenEphemeral, dest.iSDParm, p->pEList->nExpr);
    dest.eDest = SRT_Table;
  }

  /* Special handling for a compound-select that originates as a VALUES clause.
  */
  if( p->selFlags & SF_MultiValue ){
    rc = multiSelectValues(pParse, p, &dest);
    goto multi_select_end;
  }

  /* Make sure all SELECTs in the statement have the same number of elements
  ** in their result sets.
  */
  assert( p->pEList && pPrior->pEList );
  assert( p->pEList->nExpr==pPrior->pEList->nExpr );

#ifndef SQLITE_OMIT_CTE
  if( p->selFlags & SF_Recursive ){
    generateWithRecursiveQuery(pParse, p, &dest);
  }else
#endif

  /* Compound SELECTs that have an ORDER BY clause are handled separately.
  */
  if( p->pOrderBy ){
    return multiSelectOrderBy(pParse, p, pDest);
  }else{

#ifndef SQLITE_OMIT_EXPLAIN
    if( pPrior->pPrior==0 ){
      ExplainQueryPlan((pParse, 1, "COMPOUND QUERY"));
      ExplainQueryPlan((pParse, 1, "LEFT-MOST SUBQUERY"));
    }
#endif

    /* Generate code for the left and right SELECT statements.
    */
    switch( p->op ){
      case TK_ALL: {
        int addr = 0;
        int nLimit;
        assert( !pPrior->pLimit );
        pPrior->iLimit = p->iLimit;
        pPrior->iOffset = p->iOffset;
        pPrior->pLimit = p->pLimit;
        rc = sqlite3Select(pParse, pPrior, &dest);
        p->pLimit = 0;
        if( rc ){
          goto multi_select_end;
        }
        p->pPrior = 0;
        p->iLimit = pPrior->iLimit;
        p->iOffset = pPrior->iOffset;
        if( p->iLimit ){
          addr = sqlite3VdbeAddOp1(v, OP_IfNot, p->iLimit); VdbeCoverage(v);
          VdbeComment((v, "Jump ahead if LIMIT reached"));
          if( p->iOffset ){
            sqlite3VdbeAddOp3(v, OP_OffsetLimit,
                              p->iLimit, p->iOffset+1, p->iOffset);
          }
        }
        ExplainQueryPlan((pParse, 1, "UNION ALL"));
        rc = sqlite3Select(pParse, p, &dest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        if( pPrior->pLimit
         && sqlite3ExprIsInteger(pPrior->pLimit->pLeft, &nLimit)
         && nLimit>0 && p->nSelectRow > sqlite3LogEst((u64)nLimit) 
        ){
          p->nSelectRow = sqlite3LogEst((u64)nLimit);
        }
        if( addr ){
          sqlite3VdbeJumpHere(v, addr);
        }
        break;
      }
      case TK_EXCEPT:
      case TK_UNION: {
        int unionTab;    /* Cursor number of the temp table holding result */
        u8 op = 0;       /* One of the SRT_ operations to apply to self */
        int priorOp;     /* The SRT_ operation to apply to prior selects */
        Expr *pLimit;    /* Saved values of p->nLimit  */
        int addr;
        SelectDest uniondest;
  
        testcase( p->op==TK_EXCEPT );
        testcase( p->op==TK_UNION );
        priorOp = SRT_Union;
        if( dest.eDest==priorOp ){
          /* We can reuse a temporary table generated by a SELECT to our
          ** right.
          */
          assert( p->pLimit==0 );      /* Not allowed on leftward elements */
          unionTab = dest.iSDParm;
        }else{
          /* We will need to create our own temporary table to hold the
          ** intermediate results.
          */
          unionTab = pParse->nTab++;
          assert( p->pOrderBy==0 );
          addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, unionTab, 0);
          assert( p->addrOpenEphm[0] == -1 );
          p->addrOpenEphm[0] = addr;
          findRightmost(p)->selFlags |= SF_UsesEphemeral;
          assert( p->pEList );
        }
  
        /* Code the SELECT statements to our left
        */
        assert( !pPrior->pOrderBy );
        sqlite3SelectDestInit(&uniondest, priorOp, unionTab);
        rc = sqlite3Select(pParse, pPrior, &uniondest);
        if( rc ){
          goto multi_select_end;
        }
  
        /* Code the current SELECT statement
        */
        if( p->op==TK_EXCEPT ){
          op = SRT_Except;
        }else{
          assert( p->op==TK_UNION );
          op = SRT_Union;
        }
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        uniondest.eDest = op;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          selectOpName(p->op)));
        rc = sqlite3Select(pParse, p, &uniondest);
        testcase( rc!=SQLITE_OK );
        /* Query flattening in sqlite3Select() might refill p->pOrderBy.
        ** Be sure to delete p->pOrderBy, therefore, to avoid a memory leak. */
        sqlite3ExprListDelete(db, p->pOrderBy);
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->pOrderBy = 0;
        if( p->op==TK_UNION ){
          p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;
        p->iLimit = 0;
        p->iOffset = 0;
  
        /* Convert the data in the temporary table into whatever form
        ** it is that we currently need.
        */
        assert( unionTab==dest.iSDParm || dest.eDest!=priorOp );
        if( dest.eDest!=priorOp ){
          int iCont, iBreak, iStart;
          assert( p->pEList );
          iBreak = sqlite3VdbeMakeLabel(v);
          iCont = sqlite3VdbeMakeLabel(v);
          computeLimitRegisters(pParse, p, iBreak);
          sqlite3VdbeAddOp2(v, OP_Rewind, unionTab, iBreak); VdbeCoverage(v);
          iStart = sqlite3VdbeCurrentAddr(v);
          selectInnerLoop(pParse, p, unionTab,
                          0, 0, &dest, iCont, iBreak);
          sqlite3VdbeResolveLabel(v, iCont);
          sqlite3VdbeAddOp2(v, OP_Next, unionTab, iStart); VdbeCoverage(v);
          sqlite3VdbeResolveLabel(v, iBreak);
          sqlite3VdbeAddOp2(v, OP_Close, unionTab, 0);
        }
        break;
      }
      default: assert( p->op==TK_INTERSECT ); {
        int tab1, tab2;
        int iCont, iBreak, iStart;
        Expr *pLimit;
        int addr;
        SelectDest intersectdest;
        int r1;
  
        /* INTERSECT is different from the others since it requires
        ** two temporary tables.  Hence it has its own case.  Begin
        ** by allocating the tables we will need.
        */
        tab1 = pParse->nTab++;
        tab2 = pParse->nTab++;
        assert( p->pOrderBy==0 );
  
        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab1, 0);
        assert( p->addrOpenEphm[0] == -1 );
        p->addrOpenEphm[0] = addr;
        findRightmost(p)->selFlags |= SF_UsesEphemeral;
        assert( p->pEList );
  
        /* Code the SELECTs to our left into temporary table "tab1".
        */
        sqlite3SelectDestInit(&intersectdest, SRT_Union, tab1);
        rc = sqlite3Select(pParse, pPrior, &intersectdest);
        if( rc ){
          goto multi_select_end;
        }
  
        /* Code the current SELECT into temporary table "tab2"
        */
        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab2, 0);
        assert( p->addrOpenEphm[1] == -1 );
        p->addrOpenEphm[1] = addr;
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        intersectdest.iSDParm = tab2;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          selectOpName(p->op)));
        rc = sqlite3Select(pParse, p, &intersectdest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        if( p->nSelectRow>pPrior->nSelectRow ){
          p->nSelectRow = pPrior->nSelectRow;
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;
  
        /* Generate code to take the intersection of the two temporary
        ** tables.
        */
        assert( p->pEList );
        iBreak = sqlite3VdbeMakeLabel(v);
        iCont = sqlite3VdbeMakeLabel(v);
        computeLimitRegisters(pParse, p, iBreak);
        sqlite3VdbeAddOp2(v, OP_Rewind, tab1, iBreak); VdbeCoverage(v);
        r1 = sqlite3GetTempReg(pParse);
        iStart = sqlite3VdbeAddOp2(v, OP_RowData, tab1, r1);
        sqlite3VdbeAddOp4Int(v, OP_NotFound, tab2, iCont, r1, 0);
        VdbeCoverage(v);
        sqlite3ReleaseTempReg(pParse, r1);
        selectInnerLoop(pParse, p, tab1,
                        0, 0, &dest, iCont, iBreak);
        sqlite3VdbeResolveLabel(v, iCont);
        sqlite3VdbeAddOp2(v, OP_Next, tab1, iStart); VdbeCoverage(v);
        sqlite3VdbeResolveLabel(v, iBreak);
        sqlite3VdbeAddOp2(v, OP_Close, tab2, 0);
        sqlite3VdbeAddOp2(v, OP_Close, tab1, 0);
        break;
      }
    }
  
  #ifndef SQLITE_OMIT_EXPLAIN
    if( p->pNext==0 ){
      ExplainQueryPlanPop(pParse);
    }
  #endif
  }
  
  /* Compute collating sequences used by 
  ** temporary tables needed to implement the compound select.
  ** Attach the KeyInfo structure to all temporary tables.
  **
  ** This section is run by the right-most SELECT statement only.
  ** SELECT statements to the left always skip this part.  The right-most
  ** SELECT might also skip this part if it has no ORDER BY clause and
  ** no temp tables are required.
  */
  if( p->selFlags & SF_UsesEphemeral ){
    int i;                        /* Loop counter */
    KeyInfo *pKeyInfo;            /* Collating sequence for the result set */
    Select *pLoop;                /* For looping through SELECT statements */
    CollSeq **apColl;             /* For looping through pKeyInfo->aColl[] */
    int nCol;                     /* Number of columns in result set */

    assert( p->pNext==0 );
    nCol = p->pEList->nExpr;
    pKeyInfo = sqlite3KeyInfoAlloc(db, nCol, 1);
    if( !pKeyInfo ){
      rc = SQLITE_NOMEM_BKPT;
      goto multi_select_end;
    }
    for(i=0, apColl=pKeyInfo->aColl; i<nCol; i++, apColl++){
      *apColl = multiSelectCollSeq(pParse, p, i);
      if( 0==*apColl ){
        *apColl = db->pDfltColl;
      }
    }

    for(pLoop=p; pLoop; pLoop=pLoop->pPrior){
      for(i=0; i<2; i++){
        int addr = pLoop->addrOpenEphm[i];
        if( addr<0 ){
          /* If [0] is unused then [1] is also unused.  So we can
          ** always safely abort as soon as the first unused slot is found */
          assert( pLoop->addrOpenEphm[1]<0 );
          break;
        }
        sqlite3VdbeChangeP2(v, addr, nCol);
        sqlite3VdbeChangeP4(v, addr, (char*)sqlite3KeyInfoRef(pKeyInfo),
                            P4_KEYINFO);
        pLoop->addrOpenEphm[i] = -1;
      }
    }
    sqlite3KeyInfoUnref(pKeyInfo);
  }

multi_select_end:
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  sqlite3SelectDelete(db, pDelete);
  return rc;
}